

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

string * __thiscall kratos::FSM::output_table_abi_cxx11_(string *__return_storage_ptr__,FSM *this)

{
  undefined1 *puVar1;
  mapped_type pVVar2;
  long lVar3;
  char cVar4;
  pointer ppVVar5;
  ulong uVar6;
  mapped_type *ppVVar7;
  _Base_ptr p_Var8;
  Var **var;
  undefined1 auVar9 [8];
  Var **output;
  __node_base *p_Var10;
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_> __i
  ;
  long lVar11;
  key_type *ppVVar12;
  stringstream local_208 [8];
  stringstream stream;
  undefined1 auStack_78 [8];
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> outputs;
  long *local_58;
  long local_50;
  long local_48 [2];
  FSM *local_38;
  
  stream._384_8_ = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_208);
  auStack_78 = (undefined1  [8])0x0;
  outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = this;
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::reserve
            ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)auStack_78,
             (this->outputs_)._M_h._M_element_count);
  p_Var10 = &(local_38->outputs_)._M_h._M_before_begin;
  while (ppVVar5 = outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
                   .super__Vector_impl_data._M_start, auVar9 = auStack_78, p_Var10 = p_Var10->_M_nxt
        , p_Var10 != (__node_base *)0x0) {
    std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*const&>
              ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)auStack_78,(Var **)(p_Var10 + 1)
              );
  }
  if (auStack_78 !=
      (undefined1  [8])
      outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar11 = (long)outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
                   .super__Vector_impl_data._M_start - (long)auStack_78;
    uVar6 = lVar11 >> 3;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::FSM::output_table[abi:cxx11]()::__0>>
              (auStack_78,
               outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
               super__Vector_impl_data._M_start,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar11 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::FSM::output_table[abi:cxx11]()::__0>>
                (auVar9,ppVVar5);
    }
    else {
      ppVVar12 = (key_type *)((long)auVar9 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::FSM::output_table[abi:cxx11]()::__0>>
                (auVar9,ppVVar12);
      for (; ppVVar12 != ppVVar5; ppVVar12 = ppVVar12 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::FSM::output_table[abi:cxx11]()::__0>>
                  (ppVVar12);
      }
    }
  }
  puVar1 = &stream.field_0x8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"State",5);
  ppVVar5 = outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (auStack_78 !=
      (undefined1  [8])
      outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar9 = auStack_78;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,",",1);
      (*((*(key_type *)auVar9)->super_IRNode)._vptr_IRNode[0x1f])(&local_58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(char *)local_58,local_50);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      auVar9 = (undefined1  [8])((long)auVar9 + 8);
    } while (auVar9 != (undefined1  [8])ppVVar5);
  }
  cVar4 = (char)puVar1;
  std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  p_Var8 = (local_38->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = (FSM *)&(local_38->states_)._M_t._M_impl.super__Rb_tree_header;
  if ((FSM *)p_Var8 != local_38) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
      ppVVar5 = outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (auVar9 = auStack_78; auVar9 != (undefined1  [8])ppVVar5;
          auVar9 = (undefined1  [8])((long)auVar9 + 8)) {
        ppVVar7 = std::
                  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                  ::at((map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                        *)(*(long *)(p_Var8 + 2) + 0x50),(key_type *)auVar9);
        pVVar2 = *ppVVar7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,",",1);
        (*(pVVar2->super_IRNode)._vptr_IRNode[0x1f])(&local_58,pVVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar1,(char *)local_58,local_50);
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((FSM *)p_Var8 != local_38);
  }
  std::__cxx11::stringbuf::str();
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78,
                    (long)outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
  }
  std::__cxx11::stringstream::~stringstream(local_208);
  std::ios_base::~ios_base((ios_base *)&stream.field_0x78);
  return (string *)stream._384_8_;
}

Assistant:

std::string FSM::output_table() {
    std::stringstream stream;
    // sort the outputs
    std::vector<Var*> outputs;
    outputs.reserve(outputs_.size());
    for (auto const& iter : outputs_) outputs.emplace_back(iter.first);
    std::sort(outputs.begin(), outputs.end(),
              [](const auto& lhs, const auto& rhs) { return lhs->to_string() < rhs->to_string(); });
    // write the header
    stream << "State";
    for (const auto& var : outputs) stream << "," << var->to_string();
    stream << ::endl;

    // notice that we don't need to sort the state names since it's stored in map
    // which is ordered
    for (auto const& [state_name, state] : states_) {
        stream << state_name;
        for (auto const& output : outputs) {
            auto* value = state->output_values().at(output);
            stream << "," << value->to_string();
        }
        stream << ::endl;
    }

    return stream.str();
}